

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

void enet_protocol_change_state(ENetHost *host,ENetPeer *peer,ENetPeerState state)

{
  long *plVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = (int)host->peerCount - 5;
  if ((int)peer - 5U < 2) {
    if (uVar2 < 2) goto LAB_001081b6;
    lVar3 = 1;
  }
  else {
    if (1 < uVar2) goto LAB_001081b6;
    lVar3 = -1;
  }
  if (*(int *)&(host->dispatchQueue).sentinel.next != 0) {
    plVar1 = (long *)(*(long *)((long)&(host->address).field_0 + 0xc) + 0x2af0);
    *plVar1 = *plVar1 + lVar3;
  }
  plVar1 = (long *)(*(long *)((long)&(host->address).field_0 + 0xc) + 0x2ae8);
  *plVar1 = *plVar1 + lVar3;
LAB_001081b6:
  *(int *)&host->peerCount = (int)peer;
  return;
}

Assistant:

static void enet_protocol_change_state(ENetHost* host, ENetPeer* peer, ENetPeerState state) {
	if (state == ENET_PEER_STATE_CONNECTED || state == ENET_PEER_STATE_DISCONNECT_LATER)
		enet_peer_on_connect(peer);
	else
		enet_peer_on_disconnect(peer);

	peer->state = state;
}